

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Scanner::scanFlowScalar(Scanner *this,bool IsDoubleQuoted)

{
  uint AtColumn;
  char *data;
  iterator pcVar1;
  IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>
  *pIVar2;
  bool bVar3;
  bool local_c2;
  iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&>
  local_b8;
  iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&>
  local_b0;
  StringRef local_98;
  undefined1 local_88 [8];
  Token T;
  iterator i;
  uint ColStart;
  iterator Start;
  bool IsDoubleQuoted_local;
  Scanner *this_local;
  
  data = this->Current;
  AtColumn = this->Column;
  if (IsDoubleQuoted) {
    do {
      this->Current = this->Current + 1;
      while( true ) {
        bVar3 = false;
        if (this->Current != this->End) {
          bVar3 = *this->Current != '\"';
        }
        if (!bVar3) break;
        this->Current = this->Current + 1;
      }
      local_c2 = false;
      if ((this->Current != this->End) && (local_c2 = false, this->Current[-1] == '\\')) {
        local_c2 = wasEscaped(data + 1,this->Current);
      }
    } while (local_c2 != false);
  }
  else {
    skip(this,1);
    while( true ) {
      while (((this->Current + 1 < this->End && (*this->Current == '\'')) &&
             (this->Current[1] == '\''))) {
        skip(this,2);
      }
      if (*this->Current == '\'') break;
      pcVar1 = skip_nb_char(this,this->Current);
      if (pcVar1 == this->Current) {
        pcVar1 = skip_b_break(this,this->Current);
        if (pcVar1 == this->Current) break;
        this->Current = pcVar1;
        this->Column = 0;
        this->Line = this->Line + 1;
      }
      else {
        if (pcVar1 == this->End) break;
        this->Current = pcVar1;
        this->Column = this->Column + 1;
      }
    }
  }
  bVar3 = this->Current != this->End;
  if (bVar3) {
    skip(this,1);
    Token::Token((Token *)local_88);
    local_88._0_4_ = TK_Scalar;
    StringRef::StringRef(&local_98,data,(long)this->Current - (long)data);
    T._0_8_ = local_98.Data;
    T.Range.Data = (char *)local_98.Length;
    AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
    ::push_back(&this->TokenQueue,(Token *)local_88);
    local_b8.I.NodePtr =
         (ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>
          )AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
           ::end(&this->TokenQueue);
    pIVar2 = iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&>
             ::operator--(&local_b8);
    local_b0.I.NodePtr =
         (ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>
          )(pIVar2->
           super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&>
           ).I.NodePtr;
    saveSimpleKeyCandidate(this,(iterator)local_b0.I.NodePtr,AtColumn,false);
    this->IsSimpleKeyAllowed = false;
    Token::~Token((Token *)local_88);
  }
  else {
    Twine::Twine((Twine *)((long)&T.Value.field_2 + 8),"Expected quote at end of scalar");
    setError(this,(Twine *)((long)&T.Value.field_2 + 8),this->Current);
  }
  return bVar3;
}

Assistant:

bool Scanner::scanFlowScalar(bool IsDoubleQuoted) {
  StringRef::iterator Start = Current;
  unsigned ColStart = Column;
  if (IsDoubleQuoted) {
    do {
      ++Current;
      while (Current != End && *Current != '"')
        ++Current;
      // Repeat until the previous character was not a '\' or was an escaped
      // backslash.
    } while (   Current != End
             && *(Current - 1) == '\\'
             && wasEscaped(Start + 1, Current));
  } else {
    skip(1);
    while (true) {
      // Skip a ' followed by another '.
      if (Current + 1 < End && *Current == '\'' && *(Current + 1) == '\'') {
        skip(2);
        continue;
      } else if (*Current == '\'')
        break;
      StringRef::iterator i = skip_nb_char(Current);
      if (i == Current) {
        i = skip_b_break(Current);
        if (i == Current)
          break;
        Current = i;
        Column = 0;
        ++Line;
      } else {
        if (i == End)
          break;
        Current = i;
        ++Column;
      }
    }
  }

  if (Current == End) {
    setError("Expected quote at end of scalar", Current);
    return false;
  }

  skip(1); // Skip ending quote.
  Token T;
  T.Kind = Token::TK_Scalar;
  T.Range = StringRef(Start, Current - Start);
  TokenQueue.push_back(T);

  saveSimpleKeyCandidate(--TokenQueue.end(), ColStart, false);

  IsSimpleKeyAllowed = false;

  return true;
}